

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  unsigned_short **ppuVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  char *pcVar5;
  undefined8 extraout_RDX_01;
  int iVar6;
  int iVar7;
  unsigned_short *in_R8;
  undefined1 auVar8 [16];
  
  if (ptr == end) {
    return -1;
  }
  cVar1 = *(char *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar6 = 0;
  iVar7 = 0;
  switch(cVar1) {
  case '\x05':
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    auVar8 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
    do {
      ppuVar4 = (unsigned_short **)0x2;
      while( true ) {
        pcVar5 = auVar8._8_8_;
        iVar7 = iVar6;
        if (auVar8._0_4_ == 0) goto switchD_00155b53_caseD_8;
LAB_00155bff:
        while( true ) {
          ptr = (char *)((long)ptr + (long)ppuVar4);
          if (ptr == end) {
            return -1;
          }
          bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
          if (bVar2 < 0x12) break;
          ppuVar4 = (unsigned_short **)0x1;
          pcVar5 = (char *)(ulong)(bVar2 - 0x18);
          if ((3 < bVar2 - 0x18) && (bVar2 != 0x16)) {
            iVar7 = iVar6;
            if (bVar2 == 0x12) {
              ptr = (char *)((long)ptr + 1);
              iVar7 = 0x1c;
            }
            goto switchD_00155b53_caseD_8;
          }
        }
        if (bVar2 == 5) break;
        if (bVar2 == 6) {
          if ((long)end - (long)ptr < 3) {
            return -2;
          }
          auVar8 = (*enc[2].utf8Convert)(enc,(char **)ptr,pcVar5,(char **)ppuVar4,(char *)in_R8);
LAB_00155be8:
          ppuVar4 = (unsigned_short **)0x3;
        }
        else {
          iVar7 = iVar6;
          if (bVar2 != 7) goto switchD_00155b53_caseD_8;
          if ((long)end - (long)ptr < 4) {
            return -2;
          }
          auVar8 = (*enc[2].utf16Convert)(enc,(char **)ptr,pcVar5,ppuVar4,in_R8);
LAB_00155bf6:
          ppuVar4 = (unsigned_short **)0x4;
        }
      }
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
      uVar3 = (*enc[2].isPublicId)(enc,ptr,pcVar5,(char **)ppuVar4);
      auVar8._4_4_ = 0;
      auVar8._0_4_ = uVar3;
      auVar8._8_8_ = extraout_RDX_01;
    } while( true );
  case '\x06':
    if (2 < (long)(end + -(long)ptr)) {
      uVar3 = (*enc[3].scanners[0])(enc,ptr,end,(char **)(end + -(long)ptr));
      auVar8._4_4_ = 0;
      auVar8._0_4_ = uVar3;
      auVar8._8_8_ = extraout_RDX;
      goto LAB_00155be8;
    }
    return -2;
  case '\a':
    if (3 < (long)(end + -(long)ptr)) {
      uVar3 = (*enc[3].scanners[1])(enc,ptr,end,(char **)(end + -(long)ptr));
      auVar8._4_4_ = 0;
      auVar8._0_4_ = uVar3;
      auVar8._8_8_ = extraout_RDX_00;
      goto LAB_00155bf6;
    }
    return -2;
  case '\x16':
  case '\x18':
    ppuVar4 = (unsigned_short **)0x1;
    pcVar5 = end;
    goto LAB_00155bff;
  default:
    iVar7 = iVar6;
    if (cVar1 != '\x1e') goto switchD_00155b53_caseD_8;
  case '\t':
  case '\n':
  case '\x15':
    iVar7 = 0x16;
  case '\b':
  case '\v':
  case '\f':
  case '\r':
  case '\x0e':
  case '\x0f':
  case '\x10':
  case '\x11':
  case '\x12':
  case '\x13':
  case '\x14':
  case '\x17':
switchD_00155b53_caseD_8:
    *nextTokPtr = ptr;
    return iVar7;
  }
}

Assistant:

static
int PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}